

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O1

void __thiscall cfdcapi_psbt_FundPsbt_Test::TestBody(cfdcapi_psbt_FundPsbt_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  uint32_t index;
  long lVar3;
  AssertionResult gtest_ar_;
  int ret;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  int64_t fee;
  char *txid;
  char *descriptor;
  void *fund_handle;
  void *psbt_handle;
  void *handle;
  AssertHelper local_120;
  uint32_t utxo_index;
  char *output;
  uint32_t used_utxo_num;
  uint32_t vout;
  int64_t amount;
  AssertionResult gtest_ar;
  uint local_e8 [46];
  
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  gtest_ar_._0_8_ = (ulong)(uint)gtest_ar_._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&psbt_handle,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x367,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&psbt_handle,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&psbt_handle);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_.success_ = handle != (void *)0x0;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&psbt_handle);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&output,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x368,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&output,(Message *)&psbt_handle);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output);
    if ((uint *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_e8) {
      operator_delete((uint *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    }
    if (psbt_handle != (void *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (psbt_handle != (void *)0x0)) {
        (**(code **)(*psbt_handle + 8))();
      }
      psbt_handle = (void *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  psbt_handle = (void *)0x0;
  output = (char *)0x0;
  pcVar2 = "";
  ret = CfdCreatePsbtHandle(handle,1,
                            "cHNidP8BAP0+AQIAAAAG+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////AoDw+gIAAAAAFgAUsyK93OYzuFGsc3CrRU8LNnoGVOWA8PoCAAAAABYAFMq4xTpuj8ApbRzTkVowfVHEkaVVAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAAiAgNHO/yMdwwbIgoueq5LrfbA1+rykCjVsp00OAErsonvgRgqcEdgLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA=="
                            ,"",0,0,&psbt_handle);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fund_handle,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x370,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fund_handle,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fund_handle);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (ret == 0) {
    fund_handle = (void *)0x0;
    ret = CfdInitializeFundPsbt(handle,&fund_handle);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&fee,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x374,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&fee,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fee);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      memcpy(&gtest_ar,&PTR_anon_var_dwarf_26f8e9_0073e110,200);
      lVar3 = 0x18;
      do {
        ret = CfdFundPsbtAddToUtxoList
                        (handle,fund_handle,*(char **)((long)&output + lVar3),
                         *(uint32_t *)((long)&used_utxo_num + lVar3),
                         *(int64_t *)((long)&amount + lVar3),(char *)0x0,
                         *(char **)((long)local_e8 + lVar3 + -0x10),(char *)0x0,(char *)0x0);
        fee = fee & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&fee,&ret);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&fee);
          pcVar2 = "";
          if (gtest_ar_.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&txid,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x396,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&txid,(Message *)&fee);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&txid);
          if (fee != 0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (fee != 0)) {
              (**(code **)(*(long *)fee + 8))();
            }
            fee = 0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar_.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        lVar3 = lVar3 + 0x28;
      } while (lVar3 != 0xe0);
      ret = CfdSetOptionFundPsbt(handle,fund_handle,1,0,2.0,false);
      fee = fee & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&fee,&ret);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&fee);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&txid,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x39b,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&txid,(Message *)&fee);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&txid);
        if (fee != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (fee != 0)) {
            (**(code **)(*(long *)fee + 8))();
          }
          fee = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      ret = CfdSetOptionFundPsbt(handle,fund_handle,4,0,0.0,false);
      fee = fee & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&fee,&ret);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&fee);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&txid,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x39e,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&txid,(Message *)&fee);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&txid);
        if (fee != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (fee != 0)) {
            (**(code **)(*(long *)fee + 8))();
          }
          fee = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      used_utxo_num = 0;
      fee = 0;
      ret = CfdFinalizeFundPsbt(handle,psbt_handle,fund_handle,
                                "wpkh([2a704760/44\'/0\'/0\'/1/100]02f7f0d7d00289b7c5a581bc35276040c348de48fc414067f31ea26ad95c00550c)"
                                ,&fee,&used_utxo_num);
      txid = (char *)((ulong)txid._4_4_ << 0x20);
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&txid,&ret);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&txid);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&descriptor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3a5,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&descriptor,(Message *)&txid);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&descriptor);
        if (txid != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (txid != (char *)0x0)) {
            (**(code **)(*(long *)txid + 8))();
          }
          txid = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      txid = (char *)CONCAT44(txid._4_4_,1);
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&gtest_ar_,"1","used_utxo_num",(int *)&txid,&used_utxo_num);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&txid);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&descriptor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3a6,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&descriptor,(Message *)&txid);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&descriptor);
        if (txid != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (txid != (char *)0x0)) {
            (**(code **)(*(long *)txid + 8))();
          }
          txid = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      txid = (char *)CONCAT44(txid._4_4_,0x48e);
      testing::internal::CmpHelperEQ<int,long>
                ((internal *)&gtest_ar_,"1166","fee",(int *)&txid,&fee);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&txid);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&descriptor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3a7,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&descriptor,(Message *)&txid);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&descriptor);
        if (txid != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (txid != (char *)0x0)) {
            (**(code **)(*(long *)txid + 8))();
          }
          txid = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      utxo_index = 0;
      txid = (char *)0x0;
      descriptor = (char *)0x0;
      vout = 0;
      amount = 0;
      if (used_utxo_num != 0) {
        index = 0;
        do {
          ret = CfdGetFundPsbtUsedUtxo
                          (handle,fund_handle,index,&utxo_index,&txid,&vout,&amount,(char **)0x0,
                           &descriptor,(char **)0x0);
          local_158.ptr_ = local_158.ptr_ & 0xffffffff00000000;
          testing::internal::CmpHelperEQ<CfdErrorCode,int>
                    ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&local_158,&ret);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&local_158);
            pcVar2 = "";
            if (gtest_ar_.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_120,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x3b1,pcVar2);
            testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_158);
            testing::internal::AssertHelper::~AssertHelper(&local_120);
            if (local_158.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) &&
                 (local_158.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_158.ptr_ + 8))();
              }
              local_158.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&gtest_ar_.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (ret == 0) {
            testing::internal::CmpHelperSTREQ
                      ((internal *)&gtest_ar_,"utxo_list[utxo_index].txid","txid",
                       *(char **)(local_e8 + ((ulong)utxo_index * 5 + -2) * 2),txid);
            if (gtest_ar_.success_ == false) {
              testing::Message::Message((Message *)&local_158);
              pcVar2 = "";
              if (gtest_ar_.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_120,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x3b3,pcVar2);
              testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_158);
              testing::internal::AssertHelper::~AssertHelper(&local_120);
              if (local_158.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) &&
                   (local_158.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_158.ptr_ + 8))();
                }
                local_158.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&gtest_ar_.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                      ((internal *)&gtest_ar_,"utxo_list[utxo_index].vout","vout",
                       local_e8 + ((ulong)utxo_index * 5 + -1) * 2,&vout);
            if (gtest_ar_.success_ == false) {
              testing::Message::Message((Message *)&local_158);
              pcVar2 = "";
              if (gtest_ar_.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_120,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x3b4,pcVar2);
              testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_158);
              testing::internal::AssertHelper::~AssertHelper(&local_120);
              if (local_158.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) &&
                   (local_158.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_158.ptr_ + 8))();
                }
                local_158.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&gtest_ar_.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperEQ<long,long>
                      ((internal *)&gtest_ar_,"utxo_list[utxo_index].amount","amount",
                       (long *)(local_e8 + (ulong)utxo_index * 10),&amount);
            if (gtest_ar_.success_ == false) {
              testing::Message::Message((Message *)&local_158);
              pcVar2 = "";
              if (gtest_ar_.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_120,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x3b5,pcVar2);
              testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_158);
              testing::internal::AssertHelper::~AssertHelper(&local_120);
              if (local_158.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) &&
                   (local_158.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_158.ptr_ + 8))();
                }
                local_158.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&gtest_ar_.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperSTREQ
                      ((internal *)&gtest_ar_,"utxo_list[utxo_index].descriptor","descriptor",
                       *(char **)(local_e8 + (ulong)utxo_index * 10 + 2),descriptor);
            if (gtest_ar_.success_ == false) {
              testing::Message::Message((Message *)&local_158);
              pcVar2 = "";
              if (gtest_ar_.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_120,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x3b6,pcVar2);
              testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_158);
              testing::internal::AssertHelper::~AssertHelper(&local_120);
              if (local_158.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) &&
                   (local_158.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_158.ptr_ + 8))();
                }
                local_158.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&gtest_ar_.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            ret = CfdFreeStringBuffer(txid);
            local_158.ptr_ = local_158.ptr_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&local_158,&ret);
            if (gtest_ar_.success_ == false) {
              testing::Message::Message((Message *)&local_158);
              pcVar2 = "";
              if (gtest_ar_.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_120,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x3b9,pcVar2);
              testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_158);
              testing::internal::AssertHelper::~AssertHelper(&local_120);
              if (local_158.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) &&
                   (local_158.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_158.ptr_ + 8))();
                }
                local_158.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&gtest_ar_.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            txid = (char *)0x0;
            ret = CfdFreeStringBuffer(descriptor);
            local_158.ptr_ = local_158.ptr_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&local_158,&ret);
            if (gtest_ar_.success_ == false) {
              testing::Message::Message((Message *)&local_158);
              pcVar2 = "";
              if (gtest_ar_.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_120,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x3bc,pcVar2);
              testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_158);
              testing::internal::AssertHelper::~AssertHelper(&local_120);
              if (local_158.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) &&
                   (local_158.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_158.ptr_ + 8))();
                }
                local_158.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&gtest_ar_.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            descriptor = (char *)0x0;
          }
          index = index + 1;
        } while (index < used_utxo_num);
      }
      ret = CfdFreeFundPsbt(handle,fund_handle);
      local_158.ptr_ = local_158.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&local_158,&ret);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_158);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_120,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3c2,pcVar2);
        testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_158);
        testing::internal::AssertHelper::~AssertHelper(&local_120);
        if (local_158.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_158.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_158.ptr_ + 8))();
          }
          local_158.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    ret = CfdGetPsbtData(handle,psbt_handle,&output,(char **)0x0);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&fee,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x3c6,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&fee,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fee);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,"exp_psbt_base64","output",
                 "cHNidP8BAP2GAQIAAAAH+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////PEJ8leyO15eW8T031SX76GhUXNkaHrDYn/kJgHMfOosHAAAAAP////8DgPD6AgAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5YDw+gIAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVXykZgAAAAAABYAFCtuFro44oBQD4CyxXBu8C841ZCBAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAABAR+AlpgAAAAAABYAFBzoeOOg2js0MIeX/ey3YiH4VBivIgYDwCMlwyj+1iKp2I+PUxjgUmGjw6lntyEdfWdlfiten74YKnBHYCwAAIAAAACAAAAAgAEAAAAHAAAAACICA0c7/Ix3DBsiCi56rkut9sDX6vKQKNWynTQ4ASuyie+BGCpwR2AsAACAAAAAgAAAAIAAAAAAAgAAAAAiAgNkdK/yYzw1GGVTn7UrYrnW+55OI1dmKOHwoKeZNFjgbBida22GLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIC9/DX0AKJt8Wlgbw1J2BAw0jeSPxBQGfzHqJq2VwAVQwYKnBHYCwAAIAAAACAAAAAgAEAAABkAAAAAA=="
                 ,output);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&fee,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3c8,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&fee,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fee);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(output);
      output = (char *)0x0;
    }
    ret = CfdFreePsbtHandle(handle,psbt_handle);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&fee,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x3ce,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&fee,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fee);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  ret = CfdFreeHandle(handle);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fund_handle,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x3d2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fund_handle,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fund_handle);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(cfdcapi_psbt, FundPsbt) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int net_type = kCfdNetworkTestnet;
  void* psbt_handle = nullptr;
  const char* exp_psbt_base64 = "cHNidP8BAP2GAQIAAAAH+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////PEJ8leyO15eW8T031SX76GhUXNkaHrDYn/kJgHMfOosHAAAAAP////8DgPD6AgAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5YDw+gIAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVXykZgAAAAAABYAFCtuFro44oBQD4CyxXBu8C841ZCBAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAABAR+AlpgAAAAAABYAFBzoeOOg2js0MIeX/ey3YiH4VBivIgYDwCMlwyj+1iKp2I+PUxjgUmGjw6lntyEdfWdlfiten74YKnBHYCwAAIAAAACAAAAAgAEAAAAHAAAAACICA0c7/Ix3DBsiCi56rkut9sDX6vKQKNWynTQ4ASuyie+BGCpwR2AsAACAAAAAgAAAAIAAAAAAAgAAAAAiAgNkdK/yYzw1GGVTn7UrYrnW+55OI1dmKOHwoKeZNFjgbBida22GLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIC9/DX0AKJt8Wlgbw1J2BAw0jeSPxBQGfzHqJq2VwAVQwYKnBHYCwAAIAAAACAAAAAgAEAAABkAAAAAA==";
  char* output = nullptr;
  ret = CfdCreatePsbtHandle(
    handle, net_type, "cHNidP8BAP0+AQIAAAAG+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////AoDw+gIAAAAAFgAUsyK93OYzuFGsc3CrRU8LNnoGVOWA8PoCAAAAABYAFMq4xTpuj8ApbRzTkVowfVHEkaVVAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAAiAgNHO/yMdwwbIgoueq5LrfbA1+rykCjVsp00OAErsonvgRgqcEdgLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==", "", 0, 0, &psbt_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    void* fund_handle = nullptr;
    ret = CfdInitializeFundPsbt(handle, &fund_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      uint32_t utxo_list_num = 5;
      CfdUtxo utxo_list[] = {
        {
           "8b3a1f738009f99fd8b01e1ad95c5468e8fb25d5373df19697d78eec957c423c", 7, 10000000,
           "wpkh([2a704760/44'/0'/0'/1/7]03c02325c328fed622a9d88f8f5318e05261a3c3a967b7211d7d67657e2b5e9fbe)",
           nullptr
        },
        {
           "0e5b0e16148da878ee8d9f0524ac0962a22dbbb66e2dc8a6237a1d4c8c4ea9cb", 8, 10000000,
           "wpkh([2a704760/44'/0'/0'/1/8]02f505e0b5885959bd2f7e68dd73915940a5540e05c41a42f6c598ceb21bdc55f3)",
           nullptr
        },
        {
           "016b36a0a9df54d55f7b907aba8fdd3d90d797eee2bc46c5ed7dced41218e674", 9, 10000000,
           "wpkh([2a704760/44'/0'/0'/1/9]02f7af7e1c3c8627e0e662ba04ec003879d9aeaeba5a02a1e24804ef4d7b497db4)",
           nullptr
        },
        {
           "dcc65ebfb8535f96f8a51e07d5c0a94f965000bd5765159a3cc27e4edd658c69", 10, 10000000,
           "wpkh([2a704760/44'/0'/0'/1/10]03c04e76f9bc7d6433a6eb7c0c3c446213c5f361dae22929483f23718e1cee4ece)",
           nullptr
        },
        {
           "0230e7471501f9432f727583f2bc17c11f5c1132140319ba2d7a5a0145684c73", 11, 10000000,
           "wpkh([2a704760/44'/0'/0'/1/11]03798ff13e5d17c6f8c1d69ff18d516613be2fa52149b3a8c60ef959d1075a5889)",
           nullptr
        }
      };
      for (uint32_t index=0; index<utxo_list_num; ++index) {
        ret = CfdFundPsbtAddToUtxoList(handle, fund_handle, utxo_list[index].txid,
            utxo_list[index].vout, utxo_list[index].amount, nullptr, utxo_list[index].descriptor,
            nullptr, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);
      }

      ret = CfdSetOptionFundPsbt(handle, fund_handle, kCfdPsbtFundEstimateFeeRate,
          0, 2.0, false);
      EXPECT_EQ(kCfdSuccess, ret);
      ret = CfdSetOptionFundPsbt(handle, fund_handle, kCfdPsbtFundKnapsackMinChange,
          0, 0, false);
      EXPECT_EQ(kCfdSuccess, ret);

      uint32_t used_utxo_num = 0;
      int64_t fee = 0;
      ret = CfdFinalizeFundPsbt(handle, psbt_handle, fund_handle,
          "wpkh([2a704760/44'/0'/0'/1/100]02f7f0d7d00289b7c5a581bc35276040c348de48fc414067f31ea26ad95c00550c)",
          &fee, &used_utxo_num);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_EQ(1, used_utxo_num);
      EXPECT_EQ(1166, fee);

      uint32_t utxo_index = 0;
      char* txid = nullptr;
      char* descriptor = nullptr;
      uint32_t vout = 0;
      int64_t amount = 0;
      for (uint32_t index=0; index<used_utxo_num; ++index) {
        ret = CfdGetFundPsbtUsedUtxo(handle, fund_handle, index, &utxo_index,
            &txid, &vout, &amount, nullptr, &descriptor, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret == kCfdSuccess) {
          EXPECT_STREQ(utxo_list[utxo_index].txid, txid);
          EXPECT_EQ(utxo_list[utxo_index].vout, vout);
          EXPECT_EQ(utxo_list[utxo_index].amount, amount);
          EXPECT_STREQ(utxo_list[utxo_index].descriptor, descriptor);

          ret = CfdFreeStringBuffer(txid);
          EXPECT_EQ(kCfdSuccess, ret);
          txid = nullptr;
          ret = CfdFreeStringBuffer(descriptor);
          EXPECT_EQ(kCfdSuccess, ret);
          descriptor = nullptr;
        }
      }

      ret = CfdFreeFundPsbt(handle, fund_handle);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    ret = CfdGetPsbtData(handle, psbt_handle, &output, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_psbt_base64, output);
      CfdFreeStringBuffer(output);
      output = nullptr;
    }

    ret = CfdFreePsbtHandle(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}